

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintserialize.h
# Opt level: O2

ssize_t bsplib::UIntSerialize<unsigned_int>::read(int __fd,void *__buf,size_t __nbytes)

{
  byte bVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  undefined4 in_register_0000003c;
  
  *(undefined4 *)__buf = 0;
  iVar3 = 1;
  lVar2 = 0;
  iVar4 = 0;
  do {
    bVar1 = *(byte *)(CONCAT44(in_register_0000003c,__fd) + lVar2);
    lVar2 = lVar2 + 1;
    iVar4 = iVar4 + (bVar1 & 0x7f) * iVar3;
    *(int *)__buf = iVar4;
    iVar3 = iVar3 << 7;
  } while ((char)bVar1 < '\0');
  return lVar2;
}

Assistant:

static int read( const unsigned char * cs, UInt & x ) {
        x = 0;
        int i = 0;
        unsigned char m = (1 << (CHAR_BIT-1));
        unsigned char c = 0;
        UInt power = 1;
        do {
            c = cs[i++];
            x += power * (c & (m-1));
            power <<= (CHAR_BIT-1);
        } while (c & m);

        return i;
    }